

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *window;
  ImDrawList *pIVar5;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  ulong uVar8;
  int iVar9;
  ImDrawList **ppIVar10;
  int iVar11;
  ImGuiWindow *pIVar12;
  ulong uVar13;
  int n;
  ImGuiWindow *pIVar14;
  long lVar15;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiWindow *local_38 [2];
  
  pIVar6 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x10b1,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar6->FrameCountRendered = pIVar6->FrameCount;
  (pIVar6->IO).MetricsRenderWindows = 0;
  out_list = &pIVar6->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  if ((pIVar6->BackgroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar6->BackgroundDrawList);
  }
  pIVar12 = pIVar6->NavWindowingTarget;
  if ((pIVar12 == (ImGuiWindow *)0x0) || ((pIVar12->Flags & 0x2000) != 0)) {
    pIVar14 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar14 = pIVar12->RootWindow;
  }
  local_38[0] = pIVar14;
  if (pIVar12 == (ImGuiWindow *)0x0) {
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar12 = pIVar6->NavWindowingListWindow;
  }
  local_38[1] = pIVar12;
  uVar3 = (pIVar6->Windows).Size;
  uVar8 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar13 = 0;
    do {
      if ((long)(int)uVar8 <= (long)uVar13) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                      ,0x52e,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (pIVar6->Windows).Data[uVar13];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar12 && window != pIVar14) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData((ImVector<ImDrawList_*> *)
                            ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                            (ulong)((uint)window->Flags >> 0x15 & 0x10)),window);
      }
      uVar13 = uVar13 + 1;
      uVar8 = (ulong)(uint)(pIVar6->Windows).Size;
    } while (uVar13 != uVar8);
  }
  lVar15 = 0;
  do {
    pIVar12 = local_38[lVar15];
    if (((pIVar12 != (ImGuiWindow *)0x0) && (pIVar12->Active == true)) && (pIVar12->Hidden == false)
       ) {
      AddWindowToDrawData((ImVector<ImDrawList_*> *)
                          ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                          (ulong)((uint)pIVar12->Flags >> 0x15 & 0x10)),pIVar12);
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 == 1);
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar6->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar6->ForegroundDrawList,(pIVar6->IO).MousePos,
                      (pIVar6->Style).MouseCursorScale,pIVar6->MouseCursor,0xffffffff,0xff000000,
                      0x30000000);
  }
  if ((pIVar6->ForegroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar6->ForegroundDrawList);
  }
  pIVar7 = GImGui;
  if (GImGui != (ImGuiContext *)0x0) {
    (pIVar6->DrawData).Valid = true;
    iVar4 = out_list->Layers[0].Size;
    if ((long)iVar4 < 1) {
      ppIVar10 = (ImDrawList **)0x0;
    }
    else {
      ppIVar10 = (pIVar6->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar6->DrawData).CmdLists = ppIVar10;
    (pIVar6->DrawData).CmdListsCount = iVar4;
    (pIVar6->DrawData).TotalIdxCount = 0;
    (pIVar6->DrawData).TotalVtxCount = 0;
    (pIVar6->DrawData).DisplayPos.x = 0.0;
    (pIVar6->DrawData).DisplayPos.y = 0.0;
    (pIVar6->DrawData).DisplaySize = (pIVar7->IO).DisplaySize;
    (pIVar6->DrawData).FramebufferScale = (pIVar7->IO).DisplayFramebufferScale;
    if (0 < iVar4) {
      iVar9 = (pIVar6->DrawData).TotalIdxCount;
      iVar11 = (pIVar6->DrawData).TotalVtxCount;
      lVar15 = 0;
      do {
        pIVar5 = (pIVar6->DrawDataBuilder).Layers[0].Data[lVar15];
        iVar11 = iVar11 + (pIVar5->VtxBuffer).Size;
        iVar9 = iVar9 + (pIVar5->IdxBuffer).Size;
        lVar15 = lVar15 + 1;
      } while (iVar4 != lVar15);
      (pIVar6->DrawData).TotalVtxCount = iVar11;
      (pIVar6->DrawData).TotalIdxCount = iVar9;
    }
    uVar1 = (pIVar6->DrawData).TotalIdxCount;
    uVar2 = (pIVar6->DrawData).TotalVtxCount;
    (pIVar6->IO).MetricsRenderVertices = uVar2;
    (pIVar6->IO).MetricsRenderIndices = uVar1;
    if ((0 < (pIVar6->DrawData).CmdListsCount) &&
       (UNRECOVERED_JUMPTABLE = (pIVar6->IO).RenderDrawListsFn,
       UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0)) {
      (*UNRECOVERED_JUMPTABLE)(&pIVar6->DrawData);
      return;
    }
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0xd06,"ImGuiIO &ImGui::GetIO()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();

    // Add background ImDrawList
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Add foreground ImDrawList
    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}